

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerSession.cpp
# Opt level: O0

void __thiscall ki::protocol::net::ServerSession::on_keep_alive(ServerSession *this)

{
  undefined8 uVar1;
  parse_error *e;
  undefined1 local_30 [24];
  ClientKeepAlive keep_alive;
  ServerSession *this_local;
  
  keep_alive._8_8_ = this;
  control::ClientKeepAlive::ClientKeepAlive((ClientKeepAlive *)(local_30 + 0x10),0,0,0);
  Session::read_data<ki::protocol::control::ClientKeepAlive>((Session *)local_30);
  control::ClientKeepAlive::operator=
            ((ClientKeepAlive *)(local_30 + 0x10),(ClientKeepAlive *)local_30);
  control::ClientKeepAlive::~ClientKeepAlive((ClientKeepAlive *)local_30);
  uVar1 = std::chrono::_V2::steady_clock::now();
  *(undefined8 *)(&this->field_0x28 + (long)this->_vptr_ServerSession[-3]) = uVar1;
  Session::send_packet
            ((Session *)((long)&this->_vptr_ServerSession + (long)this->_vptr_ServerSession[-3]),
             true,'\x04',(Serializable *)(local_30 + 0x10));
  control::ClientKeepAlive::~ClientKeepAlive((ClientKeepAlive *)(local_30 + 0x10));
  return;
}

Assistant:

void ServerSession::on_keep_alive()
	{
		// Read the payload data into a structure
		control::ClientKeepAlive keep_alive;
		try
		{
			keep_alive = read_data<control::ClientKeepAlive>();
		}
		catch (parse_error &e)
		{
			// The KEEP_ALIVE wasn't valid...
			// Close the session
			close(SessionCloseErrorCode::INVALID_MESSAGE);
			return;
		}

		// Send the response
		m_last_received_heartbeat_time = std::chrono::steady_clock::now();
		send_packet(true, (uint8_t)control::Opcode::KEEP_ALIVE_RSP, keep_alive);
	}